

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtCapsuleBoxCollisionAlgorithm::cbtCapsuleBoxCollisionAlgorithm
          (cbtCapsuleBoxCollisionAlgorithm *this,cbtPersistentManifold *mf,
          cbtCollisionAlgorithmConstructionInfo *ci,cbtCollisionObjectWrapper *col0,
          cbtCollisionObjectWrapper *col1,bool isSwapped)

{
  cbtDispatcher *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper *pcVar3;
  
  cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm
            (&this->super_cbtActivatingCollisionAlgorithm,ci,col0,col1);
  (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
  _vptr_cbtCollisionAlgorithm = (_func_int **)&PTR__cbtCapsuleBoxCollisionAlgorithm_00b646a8;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  this->m_isSwapped = isSwapped;
  if (mf == (cbtPersistentManifold *)0x0) {
    pcVar3 = col0;
    if (isSwapped) {
      pcVar3 = col1;
      col1 = col0;
    }
    pcVar1 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pcVar1->_vptr_cbtDispatcher[6])
                      (pcVar1,pcVar3->m_collisionObject,col1->m_collisionObject);
    if ((char)iVar2 != '\0') {
      pcVar1 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
               m_dispatcher;
      iVar2 = (*pcVar1->_vptr_cbtDispatcher[3])
                        (pcVar1,pcVar3->m_collisionObject,col1->m_collisionObject);
      this->m_manifoldPtr = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar2);
      this->m_ownManifold = true;
    }
  }
  return;
}

Assistant:

cbtCapsuleBoxCollisionAlgorithm::cbtCapsuleBoxCollisionAlgorithm(cbtPersistentManifold* mf,
                                                                 const cbtCollisionAlgorithmConstructionInfo& ci,
                                                                 const cbtCollisionObjectWrapper* col0,
                                                                 const cbtCollisionObjectWrapper* col1,
                                                                 bool isSwapped)
    : cbtActivatingCollisionAlgorithm(ci, col0, col1), m_ownManifold(false), m_manifoldPtr(mf), m_isSwapped(isSwapped) {
    const cbtCollisionObjectWrapper* capsuleObjWrap = m_isSwapped ? col1 : col0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? col0 : col1;

    if (!m_manifoldPtr &&
        m_dispatcher->needsCollision(capsuleObjWrap->getCollisionObject(), boxObjWrap->getCollisionObject())) {
        m_manifoldPtr =
            m_dispatcher->getNewManifold(capsuleObjWrap->getCollisionObject(), boxObjWrap->getCollisionObject());
        m_ownManifold = true;
    }
}